

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O3

void __thiscall CaDiCaL::Internal::analyze(Internal *this)

{
  int64_t *piVar1;
  long *plVar2;
  Internal *this_00;
  iterator iVar3;
  Clause *c;
  pointer pVVar4;
  unsigned_long *puVar5;
  pointer piVar6;
  pointer puVar7;
  pointer puVar8;
  unsigned_long uVar9;
  uint uVar10;
  unsigned_long *puVar11;
  long lVar12;
  long lVar13;
  EMA *this_01;
  uint uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  Clause *pCVar18;
  unsigned_long *puVar19;
  unsigned_long *puVar20;
  pointer puVar21;
  long lVar22;
  time_t *in_RSI;
  Internal *pIVar23;
  time_t *__timer;
  int iVar24;
  ulong uVar25;
  iterator __end4;
  ulong uVar26;
  Clause *__range1;
  iterator __begin4;
  ulong uVar27;
  unsigned_long *puVar28;
  iterator __position;
  pointer piVar29;
  double s;
  double s_00;
  double s_01;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int resolvent_size;
  int open;
  int jump;
  int local_74;
  int local_70;
  int local_6c;
  ulong local_68;
  int local_5c;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_58;
  double local_50;
  uint local_48;
  int local_44;
  vector<int,_std::allocator<int>_> *local_40;
  EMA *local_38;
  
  pIVar23 = this->internal;
  if ((pIVar23->profiles).analyze.level <= (pIVar23->opts).profile) {
    time(pIVar23,in_RSI);
    start_profiling(pIVar23,&(pIVar23->profiles).analyze,s);
    pIVar23 = this->internal;
  }
  auVar31._0_8_ = (double)CONCAT44(0x43300000,(int)this->num_assigned);
  auVar31._8_4_ = (int)(this->num_assigned >> 0x20);
  auVar31._12_4_ = 0x45300000;
  EMA::update(&(this->averages).current.trail.fast,pIVar23,
              (auVar31._8_8_ - 1.9342813113834067e+25) + (auVar31._0_8_ - 4503599627370496.0),
              "averages.current.trail.fast");
  pIVar23 = this->internal;
  auVar32._0_8_ = (double)CONCAT44(0x43300000,(int)this->num_assigned);
  auVar32._8_4_ = (int)(this->num_assigned >> 0x20);
  auVar32._12_4_ = 0x45300000;
  EMA::update(&(this->averages).current.trail.slow,pIVar23,
              (auVar32._8_8_ - 1.9342813113834067e+25) + (auVar32._0_8_ - 4503599627370496.0),
              "averages.current.trail.slow");
  if (((this->external_prop == true) && (this->external_prop_is_lazy == false)) &&
     ((this->opts).exteagerreasons != 0)) {
    explain_external_propagations(this);
  }
  if (((this->opts).chrono != 0) || (this->external_prop == true)) {
    uVar14 = find_conflict_level(this,(int *)&local_68);
    if ((int)local_68 != 0) {
      backtrack(this,uVar14 - 1);
      build_chain_for_units(this,(int)local_68,this->conflict,false);
      pIVar23 = (Internal *)(local_68 & 0xffffffff);
      search_assign_driving(this,(int)local_68,this->conflict);
      this->conflict = (Clause *)0x0;
      goto LAB_007e3e1e;
    }
    pIVar23 = (Internal *)(ulong)uVar14;
    backtrack(this,uVar14);
  }
  if (this->level != 0) {
    local_38 = (EMA *)&(this->averages).current;
    pCVar18 = this->conflict;
    uVar26 = (ulong)((long)(this->trail).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->trail).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
    local_6c = 0;
    local_74 = 0;
    local_44 = (this->opts).otfs;
    local_58 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&this->lrat_chain;
    local_40 = &this->clause;
    iVar16 = 0;
    local_50 = (double)((ulong)local_50 & 0xffffffff00000000);
    uVar25 = 0;
    while( true ) {
      local_70 = 1;
      uVar14 = *(uint *)&pCVar18->field_0x8;
      *(uint *)&pCVar18->field_0x8 = uVar14 & 0xffff3fff | 0x4000;
      if ((uVar14 & 0x940) == 0x800) {
        iVar15 = recompute_glue(this,pCVar18);
        if (iVar15 < pCVar18->glue) {
          promote_clause(this,pCVar18,iVar15);
        }
        else if (((uVar14 & 0xc000) != 0) && (pCVar18->glue <= (this->opts).reducetier2glue)) {
          *(uint *)&pCVar18->field_0x8 = *(uint *)&pCVar18->field_0x8 & 0xffff3fff | 0x8000;
        }
      }
      local_5c = iVar16;
      if (this->lrat == true) {
        iVar3._M_current =
             (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>(local_58,iVar3,(unsigned_long *)pCVar18);
        }
        else {
          *iVar3._M_current = (unsigned_long)pCVar18->field_0;
          (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
      }
      iVar16 = pCVar18->size;
      uVar14 = (uint)uVar25;
      if ((long)iVar16 != 0) {
        lVar22 = 0;
        do {
          uVar17 = *(uint *)((long)&pCVar18[1].field_0 + lVar22);
          if (uVar17 != uVar14) {
            analyze_literal(this,uVar17,&local_6c,&local_74,&local_70);
          }
          lVar22 = lVar22 + 4;
        } while ((long)iVar16 * 4 != lVar22);
      }
      iVar15 = local_50._0_4_;
      iVar24 = local_70 + -1;
      if (local_5c != 0) {
        iVar24 = local_50._0_4_;
      }
      iVar16 = local_5c;
      if ((((local_44 != 0) && (0 < local_5c)) && (2 < local_70)) && (local_74 < local_70)) {
        uVar17 = *(uint *)&pCVar18[1].field_0;
        local_48 = *(uint *)((long)&pCVar18[1].field_0 + 4);
        pCVar18 = on_the_fly_strengthen(this,pCVar18,uVar14);
        if ((this->opts).bump != 0) {
          bump_variables(this);
        }
        if (pCVar18 == (Clause *)0x0) {
          puVar28 = (this->mini_chain).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          puVar5 = (this->mini_chain).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          puVar19 = puVar5 + -1;
          puVar11 = puVar28;
          if (puVar28 < puVar19 && puVar28 != puVar5) {
            do {
              puVar20 = puVar11 + 1;
              uVar9 = *puVar11;
              *puVar11 = *puVar19;
              *puVar19 = uVar9;
              puVar19 = puVar19 + -1;
              puVar11 = puVar20;
            } while (puVar20 < puVar19);
          }
          uVar17 = uVar17 ^ local_48;
          if (puVar28 != puVar5) {
            do {
              local_68 = *puVar28;
              iVar3._M_current =
                   (this->lrat_chain).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (this->lrat_chain).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>(local_58,iVar3,&local_68);
              }
              else {
                *iVar3._M_current = local_68;
                (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              }
              puVar28 = puVar28 + 1;
            } while (puVar28 != puVar5);
          }
          puVar7 = (this->mini_chain).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((this->mini_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish != puVar7) {
            (this->mini_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish = puVar7;
          }
          iVar15 = -(uVar17 ^ uVar14);
          clear_analyzed_levels(this);
          piVar29 = (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          __position._M_current =
               (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current != piVar29) {
            (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = piVar29;
            __position._M_current = piVar29;
          }
          goto LAB_007e443e;
        }
        if ((local_5c == 1) && (local_74 < iVar15)) {
          c = this->conflict;
          piVar1 = &(this->stats).subsumed;
          *piVar1 = *piVar1 + 1;
          plVar2 = (long *)((long)&(this->stats).subirr + (ulong)(*(uint *)&c->field_0x8 >> 8 & 8));
          *plVar2 = *plVar2 + 1;
          if (((c->field_0x9 & 8) == 0) && ((*(uint *)&pCVar18->field_0x8 >> 0xb & 1) != 0)) {
            *(uint *)&pCVar18->field_0x8 = *(uint *)&pCVar18->field_0x8 & 0xfffff7ff;
            if (this->proof != (Proof *)0x0) {
              Proof::strengthen(this->proof,(pCVar18->field_0).id);
            }
            mark_garbage(this,c);
            piVar1 = &(this->stats).irrlits;
            *piVar1 = *piVar1 + (long)pCVar18->size;
            lVar22 = (this->stats).current.irredundant;
            lVar12 = (this->stats).added.redundant;
            lVar13 = (this->stats).added.irredundant;
            (this->stats).current.redundant = (this->stats).current.redundant + -1;
            (this->stats).current.irredundant = lVar22 + 1;
            (this->stats).added.redundant = lVar12 + -1;
            (this->stats).added.irredundant = lVar13 + 1;
          }
          else {
            mark_garbage(this,c);
          }
          piVar1 = &(this->stats).otfs.subsumed;
          *piVar1 = *piVar1 + 1;
          piVar1 = &(this->stats).subsumed;
          *piVar1 = *piVar1 + 1;
          piVar1 = &(this->stats).conflicts;
          *piVar1 = *piVar1 + 1;
        }
        this->conflict = pCVar18;
        if (local_6c == 1) {
          if ((long)pCVar18->size == 0) {
            uVar14 = 0;
            iVar16 = 0;
          }
          else {
            lVar22 = 0;
            uVar14 = 0;
            iVar16 = 0;
            do {
              uVar17 = *(uint *)((long)&pCVar18[1].field_0 + lVar22);
              uVar10 = -uVar17;
              if (0 < (int)uVar17) {
                uVar10 = uVar17;
              }
              iVar15 = (this->vtab).super__Vector_base<CaDiCaL::Var,_std::allocator<CaDiCaL::Var>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar10].level;
              iVar24 = iVar16;
              if (iVar16 < iVar15) {
                iVar24 = iVar15;
              }
              if (iVar15 != this->level) {
                iVar16 = iVar24;
                uVar17 = uVar14;
              }
              uVar14 = uVar17;
              lVar22 = lVar22 + 4;
            } while ((long)pCVar18->size * 4 != lVar22);
          }
          iVar16 = determine_actual_backtrack_level(this,iVar16);
          EMA::update(&(this->averages).current.level,this->internal,(double)iVar16,
                      "averages.current.level");
          backtrack(this,iVar16);
          pIVar23 = (Internal *)(ulong)uVar14;
          search_assign_driving(this,uVar14,this->conflict);
          this->conflict = (Clause *)0x0;
          clear_analyzed_literals(this);
          clear_analyzed_levels(this);
          piVar29 = (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish != piVar29) {
            (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = piVar29;
          }
          goto LAB_007e3e1e;
        }
        clear_analyzed_literals(this);
        piVar29 = (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar29) {
          (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar29;
        }
        local_74 = 0;
        local_70 = 1;
        local_6c = 0;
        uVar14 = *(uint *)&pCVar18->field_0x8;
        *(uint *)&pCVar18->field_0x8 = uVar14 & 0xffff3fff | 0x4000;
        if ((uVar14 & 0x940) == 0x800) {
          iVar16 = recompute_glue(this,pCVar18);
          if (iVar16 < pCVar18->glue) {
            promote_clause(this,pCVar18,iVar16);
          }
          else if (((uVar14 & 0xc000) != 0) && (pCVar18->glue <= (this->opts).reducetier2glue)) {
            *(uint *)&pCVar18->field_0x8 = *(uint *)&pCVar18->field_0x8 & 0xffff3fff | 0x8000;
          }
        }
        if (this->lrat == true) {
          iVar3._M_current =
               (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>(local_58,iVar3,(unsigned_long *)pCVar18);
          }
          else {
            *iVar3._M_current = (unsigned_long)pCVar18->field_0;
            (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
        }
        iVar16 = pCVar18->size;
        if ((long)iVar16 != 0) {
          lVar22 = 0;
          do {
            iVar15 = *(int *)((long)&pCVar18[1].field_0 + lVar22);
            if (iVar15 != 0) {
              analyze_literal(this,iVar15,&local_6c,&local_74,&local_70);
            }
            lVar22 = lVar22 + 4;
          } while ((long)iVar16 * 4 != lVar22);
        }
        iVar24 = local_70 + -1;
        iVar16 = 0;
      }
      pVVar4 = (this->vtab).super__Vector_base<CaDiCaL::Var,_std::allocator<CaDiCaL::Var>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar26 = (ulong)(int)uVar26;
      do {
        uVar14 = (this->trail).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar26 - 1];
        uVar17 = -uVar14;
        if (0 < (int)uVar14) {
          uVar17 = uVar14;
        }
        uVar25 = 0;
        if (((uint)(this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar17] & 1) != 0) {
          if (pVVar4[uVar17].level != this->level) {
            uVar14 = 0;
          }
          uVar25 = (ulong)uVar14;
        }
        uVar26 = uVar26 - 1;
        iVar15 = (int)uVar25;
      } while (iVar15 == 0);
      local_6c = local_6c + -1;
      if (local_6c == 0) break;
      local_50 = (double)CONCAT44(local_50._4_4_,iVar24);
      uVar27 = uVar25;
      if (iVar15 < 1) {
        uVar27 = (ulong)(uint)-iVar15;
      }
      pCVar18 = pVVar4[uVar27].reason;
      if (pCVar18 == this->external_reason) {
        pCVar18 = learn_external_reason_clause(this,-iVar15,0,true);
        (this->vtab).super__Vector_base<CaDiCaL::Var,_std::allocator<CaDiCaL::Var>_>._M_impl.
        super__Vector_impl_data._M_start[uVar27].reason = pCVar18;
      }
      iVar16 = iVar16 + 1;
      local_74 = local_74 + -1;
    }
    __position._M_current =
         (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
LAB_007e443e:
    this_01 = local_38;
    uVar14 = -iVar15;
    local_68 = CONCAT44(local_68._4_4_,uVar14);
    local_5c = iVar15;
    if (__position._M_current ==
        (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (local_40,__position,(int *)&local_68);
      piVar29 = (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    else {
      *__position._M_current = uVar14;
      piVar29 = __position._M_current + 1;
      (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = piVar29;
    }
    piVar6 = (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar16 = (int)((ulong)((long)(this->levels).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->levels).super__Vector_base<int,_std::allocator<int>_>._M_impl
                                .super__Vector_impl_data._M_start) >> 2) + -1;
    local_50 = (double)iVar16;
    EMA::update(this_01,this->internal,local_50,"averages.current.glue.fast");
    EMA::update(&(this->averages).current.glue.slow,this->internal,local_50,
                "averages.current.glue.slow");
    iVar15 = (int)((ulong)((long)piVar29 - (long)piVar6) >> 2);
    lVar22 = (this->stats).learned.clauses;
    (this->stats).learned.literals = (long)iVar15 + (this->stats).learned.literals;
    (this->stats).learned.clauses = lVar22 + 1;
    if (iVar15 < 2) {
      if (this->external->learner != (Learner *)0x0) {
        External::export_learned_unit_clause(this->external,uVar14);
      }
    }
    else {
      if ((this->opts).shrink == 0) {
        if ((this->opts).minimize != 0) {
          minimize_clause(this);
        }
      }
      else {
        shrink_and_minimize_clause(this);
      }
      iVar15 = (int)((ulong)((long)(this->clause).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->clause).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
      if ((this->opts).bump != 0) {
        bump_variables(this);
      }
      if (this->external->learner != (Learner *)0x0) {
        External::export_learned_large_clause(this->external,local_40);
      }
    }
    auVar30._0_4_ = -(uint)(iVar15 == 1);
    auVar30._4_4_ = -(uint)(iVar15 == 2);
    auVar30._8_4_ = -(uint)(iVar15 == 2);
    auVar30._12_4_ = 0xffffffff;
    auVar30 = auVar30 & _DAT_0091d6e0;
    (this->stats).units = (this->stats).units + auVar30._0_8_;
    (this->stats).binaries = (this->stats).binaries + auVar30._8_8_;
    EMA::update(&(this->averages).current.size,this->internal,(double)iVar15,"averages.current.size"
               );
    if (this->lrat == true) {
      puVar19 = (this->unit_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar28 = (this->unit_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar19 != puVar28) {
        do {
          local_68 = *puVar19;
          iVar3._M_current =
               (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>(local_58,iVar3,&local_68);
          }
          else {
            *iVar3._M_current = local_68;
            (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          puVar19 = puVar19 + 1;
        } while (puVar19 != puVar28);
        puVar7 = (this->unit_chain).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->unit_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish != puVar7) {
          (this->unit_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar7;
        }
      }
      puVar7 = (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar8 = (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      puVar21 = puVar8 + -1;
      if (puVar7 < puVar21 && puVar7 != puVar8) {
        do {
          puVar19 = puVar7 + 1;
          uVar9 = *puVar7;
          *puVar7 = *puVar21;
          *puVar21 = uVar9;
          puVar21 = puVar21 + -1;
          puVar7 = puVar19;
        } while (puVar19 < puVar21);
      }
    }
    pCVar18 = new_driving_clause(this,iVar16,(int *)&local_68);
    iVar16 = (int)local_68;
    EMA::update(&(this->averages).current.jump,this->internal,(double)(int)local_68,
                "averages.current.jump");
    uVar17 = determine_actual_backtrack_level(this,iVar16);
    EMA::update(&(this->averages).current.level,this->internal,(double)(int)uVar17,
                "averages.current.level");
    __timer = (time_t *)(ulong)uVar17;
    backtrack(this,uVar17);
    if (local_5c == 0) {
      learn_empty_clause(this);
    }
    else {
      __timer = (time_t *)(ulong)uVar14;
      search_assign_driving(this,uVar14,pCVar18);
    }
    if (this->stable == true) {
      Reluctant::tick(&this->reluctant);
    }
    clear_analyzed_literals(this);
    clear_unit_analyzed_literals(this);
    clear_analyzed_levels(this);
    piVar29 = (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish != piVar29) {
      (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = piVar29;
    }
    this->conflict = (Clause *)0x0;
    puVar7 = (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_finish != puVar7) {
      (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar7;
    }
    pIVar23 = this->internal;
    if ((pIVar23->profiles).analyze.level <= (pIVar23->opts).profile) {
      time(pIVar23,__timer);
      stop_profiling(pIVar23,&(pIVar23->profiles).analyze,s_01);
    }
    if (pCVar18 == (Clause *)0x0) {
      return;
    }
    if ((this->opts).eagersubsume == 0) {
      return;
    }
    eagerly_subsume_recently_learned_clauses(this,pCVar18);
    return;
  }
  learn_empty_clause(this);
  if (this->external->learner != (Learner *)0x0) {
    External::export_learned_empty_clause(this->external);
  }
LAB_007e3e1e:
  this_00 = this->internal;
  if ((this_00->profiles).analyze.level <= (this_00->opts).profile) {
    time(this_00,(time_t *)pIVar23);
    stop_profiling(this_00,&(this_00->profiles).analyze,s_00);
  }
  return;
}

Assistant:

void Internal::analyze () {

  START (analyze);

  assert (conflict);
  assert (lrat_chain.empty ());
  assert (unit_chain.empty ());
  assert (unit_analyzed.empty ());
  assert (clause.empty ());

  // First update moving averages of trail height at conflict.
  //
  UPDATE_AVERAGE (averages.current.trail.fast, num_assigned);
  UPDATE_AVERAGE (averages.current.trail.slow, num_assigned);

  /*----------------------------------------------------------------------*/

  if (external_prop && !external_prop_is_lazy && opts.exteagerreasons) {
    explain_external_propagations ();
  }

  if (opts.chrono || external_prop) {

    int forced;

    const int conflict_level = find_conflict_level (forced);

    // In principle we can perform conflict analysis as in non-chronological
    // backtracking except if there is only one literal with the maximum
    // assignment level in the clause.  Then standard conflict analysis is
    // unnecessary and we can use the conflict as a driving clause.  In the
    // pseudo code of the SAT'18 paper on chronological backtracking this
    // corresponds to the situation handled in line 4-6 in Alg. 1, except
    // that the pseudo code in the paper only backtracks while we eagerly
    // assign the single literal on the highest decision level.

    if (forced) {

      assert (forced);
      assert (conflict_level > 0);
      LOG ("single highest level literal %d", forced);

      // The pseudo code in the SAT'18 paper actually backtracks to the
      // 'second highest decision' level, while their code backtracks
      // to 'conflict_level-1', which is more in the spirit of chronological
      // backtracking anyhow and thus we also do the latter.
      //
      backtrack (conflict_level - 1);

      // if we are on decision level 0 search assign will learn unit
      // so we need a valid chain here (of course if we are not on decision
      // level 0 this will not result in a valid chain).
      // we can just use build_chain_for_units in propagate
      //
      build_chain_for_units (forced, conflict, 0);

      LOG ("forcing %d", forced);
      search_assign_driving (forced, conflict);

      conflict = 0;
      STOP (analyze);
      return;
    }

    // Backtracking to the conflict level is in the pseudo code in the
    // SAT'18 chronological backtracking paper, but not in their actual
    // implementation.  In principle we do not need to backtrack here.
    // However, as a side effect of backtracking to the conflict level we
    // set 'level' to the conflict level which then allows us to reuse the
    // old 'analyze' code as is.  The alternative (which we also tried but
    // then abandoned) is to use 'conflict_level' instead of 'level' in the
    // analysis, which however requires to pass it to the 'analyze_reason'
    // and 'analyze_literal' functions.
    //
    backtrack (conflict_level);
  }

  // Actual conflict on root level, thus formula unsatisfiable.
  //
  if (!level) {
    learn_empty_clause ();
    if (external->learner)
      external->export_learned_empty_clause ();
    // lrat_chain.clear (); done in learn_empty_clause
    STOP (analyze);
    return;
  }

  /*----------------------------------------------------------------------*/

  // First derive the 1st UIP clause by going over literals assigned on the
  // current decision level.  Literals in the conflict are marked as 'seen'
  // as well as all literals in reason clauses of already 'seen' literals on
  // the current decision level.  Thus the outer loop starts with the
  // conflict clause as 'reason' and then uses the 'reason' of the next
  // seen literal on the trail assigned on the current decision level.
  // During this process maintain the number 'open' of seen literals on the
  // current decision level with not yet processed 'reason'.  As soon 'open'
  // drops to one, we have found the first unique implication point.  This
  // is sound because the topological order in which literals are processed
  // follows the assignment order and a more complex algorithm to find
  // articulation points is not necessary.
  //
  Clause *reason = conflict;
  LOG (reason, "analyzing conflict");

  assert (clause.empty ());
  assert (lrat_chain.empty ());

  const auto &t = &trail;
  int i = t->size ();      // Start at end-of-trail.
  int open = 0;            // Seen but not processed on this level.
  int uip = 0;             // The first UIP literal.
  int resolvent_size = 0;  // without the uip
  int antecedent_size = 1; // with the uip and without unit literals
  int conflict_size =
      0; // size of the conflict without the uip and without unit literals
  int resolved = 0; // number of resolution (0 = clause in CNF)
  const bool otfs = opts.otfs;

  for (;;) {
    antecedent_size = 1; // for uip
    analyze_reason (uip, reason, open, resolvent_size, antecedent_size);
    if (resolved == 0)
      conflict_size = antecedent_size - 1;
    assert (resolvent_size == open + (int) clause.size ());

    if (otfs && resolved > 0 && antecedent_size > 2 &&
        resolvent_size < antecedent_size) {
      assert (reason != conflict);
      LOG (analyzed, "found candidate for OTFS conflict");
      LOG (clause, "found candidate for OTFS conflict");
      LOG (reason, "found candidate (size %d) for OTFS resolvent",
           antecedent_size);
      const int other = reason->literals[0] ^ reason->literals[1] ^ uip;
      assert (other != uip);
      reason = on_the_fly_strengthen (reason, uip);
      if (opts.bump)
        bump_variables ();

      assert (conflict_size);
      if (!reason) {
        uip = -other;
        assert (open == 1);
        LOG ("clause is actually unit %d, stopping", -uip);
        reverse (begin (mini_chain), end (mini_chain));
        for (auto id : mini_chain)
          lrat_chain.push_back (id);
        mini_chain.clear ();
        clear_analyzed_levels ();
        assert (!opts.exteagerreasons);
        clause.clear ();
        break;
      }
      assert (conflict_size >= 2);

      if (resolved == 1 && resolvent_size < conflict_size) {
        // in this case both clauses are part of the CNF, so one subsumes
        // the other
        otfs_subsume_clause (reason, conflict);
        LOG (reason, "changing conflict to");
        --conflict_size;
        assert (conflict_size == reason->size);
        ++stats.otfs.subsumed;
        ++stats.subsumed;
        ++stats.conflicts;
      }

      LOG (reason, "changing conflict to");
      conflict = reason;
      if (open == 1) {
        int forced = 0;
        const int conflict_level = otfs_find_backtrack_level (forced);
        int new_level = determine_actual_backtrack_level (conflict_level);
        UPDATE_AVERAGE (averages.current.level, new_level);
        backtrack (new_level);

        LOG ("forcing %d", forced);
        search_assign_driving (forced, conflict);

        conflict = 0;
        // Clean up.
        //
        clear_analyzed_literals ();
        clear_analyzed_levels ();
        clause.clear ();
        STOP (analyze);
        return;
      }

      resolved = 0;
      clear_analyzed_literals ();
      // clear_analyzed_levels (); not needed because marking the exact same
      // again
      clause.clear ();
      resolvent_size = 0;
      antecedent_size = 1;
      open = 0;
      analyze_reason (0, reason, open, resolvent_size, antecedent_size);
      conflict_size = antecedent_size - 1;
      assert (open > 1);
    }

    ++resolved;

    uip = 0;
    while (!uip) {
      assert (i > 0);
      const int lit = (*t)[--i];
      if (!flags (lit).seen)
        continue;
      if (var (lit).level == level)
        uip = lit;
    }
    if (!--open)
      break;
    reason = var (uip).reason;
    if (reason == external_reason) {
      assert (!opts.exteagerreasons);
      reason = learn_external_reason_clause (-uip, 0, true);
      var (uip).reason = reason;
    }
    assert (reason != external_reason);
    LOG (reason, "analyzing %d reason", uip);
    assert (resolvent_size);
    --resolvent_size;
  }
  LOG ("first UIP %d", uip);
  clause.push_back (-uip);

  // Update glue and learned (1st UIP literals) statistics.
  //
  int size = (int) clause.size ();
  const int glue = (int) levels.size () - 1;
  LOG (clause, "1st UIP size %d and glue %d clause", size, glue);
  UPDATE_AVERAGE (averages.current.glue.fast, glue);
  UPDATE_AVERAGE (averages.current.glue.slow, glue);
  stats.learned.literals += size;
  stats.learned.clauses++;
  assert (glue < size);

  // up to this point lrat_chain contains the proof for current clause in
  // reversed order. in minimize and shrink the clause is changed and
  // therefore lrat_chain has to be extended. Unfortunately we cannot create
  // the chain directly during minimization (or shrinking) but afterwards we
  // can calculate it pretty easily and even better the same algorithm works
  // for both shrinking and minimization.

  // Minimize the 1st UIP clause as pioneered by Niklas Soerensson in
  // MiniSAT and described in our joint SAT'09 paper.
  //
  if (size > 1) {
    if (opts.shrink)
      shrink_and_minimize_clause ();
    else if (opts.minimize)
      minimize_clause ();

    size = (int) clause.size ();

    // Update decision heuristics.
    //
    if (opts.bump)
      bump_variables ();

    if (external->learner)
      external->export_learned_large_clause (clause);
  } else if (external->learner)
    external->export_learned_unit_clause (-uip);

  // Update actual size statistics.
  //
  stats.units += (size == 1);
  stats.binaries += (size == 2);
  UPDATE_AVERAGE (averages.current.size, size);

  // reverse lrat_chain. We could probably work with reversed iterators
  // (views) to be more efficient but we would have to distinguish in proof
  //
  if (lrat) {
    LOG (unit_chain, "unit chain: ");
    for (auto id : unit_chain)
      lrat_chain.push_back (id);
    unit_chain.clear ();
    reverse (lrat_chain.begin (), lrat_chain.end ());
  }

  // Determine back-jump level, learn driving clause, backtrack and assign
  // flipped 1st UIP literal.
  //
  int jump;
  Clause *driving_clause = new_driving_clause (glue, jump);
  UPDATE_AVERAGE (averages.current.jump, jump);

  int new_level = determine_actual_backtrack_level (jump);
  UPDATE_AVERAGE (averages.current.level, new_level);
  backtrack (new_level);

  // It should hold that (!level <=> size == 1)
  //                 and (!uip   <=> size == 0)
  // this means either we have already learned a clause => size >= 2
  // in this case we will not learn empty clause or unit here
  // or we haven't actually learned a clause in new_driving_clause
  // then lrat_chain is still valid and we will learn a unit or empty clause
  //
  if (uip) {
    search_assign_driving (-uip, driving_clause);
  } else
    learn_empty_clause ();

  if (stable)
    reluctant.tick (); // Reluctant has its own 'conflict' counter.

  // Clean up.
  //
  clear_analyzed_literals ();
  clear_unit_analyzed_literals ();
  clear_analyzed_levels ();
  clause.clear ();
  conflict = 0;

  lrat_chain.clear ();
  STOP (analyze);

  if (driving_clause && opts.eagersubsume)
    eagerly_subsume_recently_learned_clauses (driving_clause);
}